

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergeFromImpl<true>
               (ZeroCopyInputStream *input,MessageLite *msg,ParseFlags parse_flags)

{
  long lVar1;
  long *in_RSI;
  ParseContext ctx;
  char *ptr;
  undefined4 in_stack_ffffffffffffff58;
  ParseFlags in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool bVar2;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  ParseContext *in_stack_ffffffffffffff70;
  undefined8 local_28;
  bool local_1;
  
  io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             SUB41((uint)in_stack_ffffffffffffff68 >> 0x18,0),
             (char **)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (ZeroCopyInputStream **)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  lVar1 = (**(code **)(*in_RSI + 0x58))(in_RSI,local_28,&stack0xffffffffffffff68);
  bVar2 = false;
  if (lVar1 != 0) {
    bVar2 = EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)&stack0xffffffffffffff68);
  }
  if (bVar2 == false) {
    local_1 = false;
  }
  else {
    local_1 = protobuf::anon_unknown_18::CheckFieldPresence
                        ((ParseContext *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (MessageLite *)CONCAT17(bVar2,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
  }
  return local_1;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}